

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznonlinanalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinearAnalysis::ComputeTangent
          (TPZNonLinearAnalysis *this,TPZFMatrix<double> *tangent,TPZVec<double> *coefs,int icase)

{
  long lVar1;
  int64_t iVar2;
  TPZStructMatrix *pTVar3;
  TPZAutoPointer<TPZGuiInterface> *in_RSI;
  long in_RDI;
  TPZFMatrix<double> rhs;
  int neq;
  TPZGuiInterface *in_stack_ffffffffffffff38;
  TPZAutoPointer<TPZGuiInterface> *in_stack_ffffffffffffff40;
  TPZCompMesh *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<double> *in_stack_ffffffffffffff60;
  
  iVar2 = TPZCompMesh::NEquations(in_stack_ffffffffffffff50);
  (*(code *)in_RSI->fRef[7].fPointer)(in_RSI,(long)(int)iVar2);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(int64_t)in_stack_ffffffffffffff50)
  ;
  pTVar3 = TPZAutoPointer<TPZStructMatrix>::operator->
                     ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x2a0));
  lVar1 = *(long *)(*(long *)pTVar3 + -0x60);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  (**(code **)(*(long *)(&pTVar3->field_0x0 + lVar1) + 0x48))
            (&pTVar3->field_0x0 + lVar1,in_RSI,&stack0xffffffffffffff50,&stack0xffffffffffffff38);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(in_RSI);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c48820);
  return;
}

Assistant:

void TPZNonLinearAnalysis::ComputeTangent(TPZFMatrix<STATE> &tangent, TPZVec<REAL> &coefs, int icase){
	
	int neq = fCompMesh->NEquations();
	tangent.Redim(neq,neq);
	TPZFMatrix<STATE> rhs(neq,1);
	fStructMatrix->Assemble(tangent,rhs,NULL);
}